

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O0

Error __thiscall asmjit::_abi_1_10::x86::Assembler::onAttach(Assembler *this,CodeHolder *code)

{
  Arch AVar1;
  bool bVar2;
  InstOptions b;
  BaseAssembler *in_RSI;
  Assembler *in_RDI;
  Error _err;
  Arch arch;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar3;
  Error local_4;
  
  AVar1 = CodeHolder::arch((CodeHolder *)0x186771);
  uVar3 = CONCAT13(AVar1,(int3)in_stack_ffffffffffffffe4);
  local_4 = BaseAssembler::onAttach(in_RSI,(CodeHolder *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
  if (local_4 == 0) {
    bVar2 = Environment::is32Bit((Arch)((uint)uVar3 >> 0x18));
    if (bVar2) {
      _abi_1_10::operator|=
                (&(in_RDI->super_BaseAssembler).super_BaseEmitter._forcedInstOptions,kX86_InvalidRex
                );
      _setAddressOverrideMask(in_RDI,0x40);
    }
    else {
      b = _abi_1_10::operator~(kX86_InvalidRex);
      operator&=(&(in_RDI->super_BaseAssembler).super_BaseEmitter._forcedInstOptions,b);
      _setAddressOverrideMask(in_RDI,0x80);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

Error Assembler::onAttach(CodeHolder* code) noexcept {
  Arch arch = code->arch();
  ASMJIT_PROPAGATE(Base::onAttach(code));

  if (Environment::is32Bit(arch)) {
    // 32 bit architecture - X86.
    _forcedInstOptions |= InstOptions::kX86_InvalidRex;
    _setAddressOverrideMask(kX86MemInfo_67H_X86);
  }
  else {
    // 64 bit architecture - X64.
    _forcedInstOptions &= ~InstOptions::kX86_InvalidRex;
    _setAddressOverrideMask(kX86MemInfo_67H_X64);
  }

  return kErrorOk;
}